

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteString
               (int field_number,string *value,CodedOutputStream *output)

{
  pointer data;
  bool bVar1;
  uint uVar2;
  LogMessage *other;
  ulong uVar3;
  int size;
  uint uVar4;
  ulong uVar5;
  size_t __n;
  byte *pbVar6;
  byte *pbVar7;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar4 = field_number << 3;
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  if (uVar4 < 0x80) {
    *pbVar6 = (byte)uVar4 | 2;
    pbVar6 = pbVar6 + 1;
  }
  else {
    *pbVar6 = (byte)uVar4 | 0x82;
    if (uVar4 < 0x4000) {
      pbVar6[1] = (byte)(uVar4 >> 7);
      pbVar6 = pbVar6 + 2;
    }
    else {
      pbVar6 = pbVar6 + 2;
      uVar4 = uVar4 >> 7;
      do {
        pbVar7 = pbVar6;
        pbVar7[-1] = (byte)uVar4 | 0x80;
        uVar2 = uVar4 >> 7;
        pbVar6 = pbVar7 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar2;
      } while (bVar1);
      *pbVar7 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar6;
  uVar5 = value->_M_string_length;
  if ((uVar5 & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x1e2);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
    uVar5 = value->_M_string_length;
    pbVar6 = output->cur_;
  }
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  if ((uint)uVar5 < 0x80) {
    *pbVar6 = (byte)uVar5;
    pbVar6 = pbVar6 + 1;
  }
  else {
    *pbVar6 = (byte)uVar5 | 0x80;
    uVar3 = uVar5 >> 7 & 0x1ffffff;
    if ((uint)uVar5 < 0x4000) {
      pbVar6[1] = (byte)uVar3;
      pbVar6 = pbVar6 + 2;
    }
    else {
      pbVar6 = pbVar6 + 2;
      do {
        pbVar7 = pbVar6;
        uVar4 = (uint)uVar3;
        pbVar7[-1] = (byte)uVar3 | 0x80;
        uVar2 = uVar4 >> 7;
        uVar3 = (ulong)uVar2;
        pbVar6 = pbVar7 + 1;
      } while (0x3fff < uVar4);
      *pbVar7 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar6;
  data = (value->_M_dataplus)._M_p;
  size = (int)value->_M_string_length;
  __n = (size_t)size;
  if ((long)(output->impl_).end_ - (long)pbVar6 < (long)__n) {
    pbVar6 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,data,size,pbVar6);
  }
  else {
    memcpy(pbVar6,data,__n);
    pbVar6 = pbVar6 + __n;
  }
  output->cur_ = pbVar6;
  return;
}

Assistant:

void WireFormatLite::WriteString(int field_number, const std::string& value,
                                 io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}